

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_resampler.cpp
# Opt level: O3

void __thiscall cubeb_individual_methods_Test::TestBody(cubeb_individual_methods_Test *this)

{
  bool bVar1;
  stringstream *psVar2;
  char *pcVar3;
  uint uVar4;
  float fVar5;
  AssertionResult gtest_ar_1;
  uint32_t frames_needed2;
  uint32_t frames_needed1;
  cubeb_resampler_speex_one_way<float> one_way;
  delay_line<float> dl;
  float buffer [512];
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_8e0;
  AssertHelper local_8d8;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_8d0;
  uint local_8c8 [2];
  AssertHelper local_8c0;
  cubeb_resampler_speex_one_way<float> local_8b8;
  undefined8 local_860;
  undefined4 local_858;
  auto_array<float> local_850;
  void *pvStack_838;
  undefined8 local_830;
  undefined8 uStack_828;
  undefined4 local_820;
  internal local_818 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_810 [255];
  
  local_860 = 0xa00000002;
  uVar4 = 0;
  local_858 = 0;
  local_850.data_ = (float *)0x0;
  local_850.capacity_ = 0;
  local_850.length_ = 0;
  pvStack_838 = (void *)0x0;
  local_830 = 0;
  uStack_828 = 0;
  local_820 = 0xac44;
  auto_array<float>::push_silence(&local_850,0x14);
  local_8c8[1] = 0;
  local_8b8._vptr_cubeb_resampler_speex_one_way =
       (_func_int **)((ulong)local_8b8._vptr_cubeb_resampler_speex_one_way._4_4_ << 0x20);
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
            (local_818,"frames_needed1","0u",local_8c8 + 1,(uint *)&local_8b8);
  if (local_818[0] == (internal)0x0) {
    psVar2 = (stringstream *)operator_new(0x188);
    std::__cxx11::stringstream::stringstream(psVar2);
    *(undefined8 *)(psVar2 + *(long *)(*(long *)(psVar2 + 0x10) + -0x18) + 0x18) = 0x11;
    if (local_810[0].ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_810[0].ptr_)->_M_dataplus)._M_p;
    }
    local_8b8._vptr_cubeb_resampler_speex_one_way = (_func_int **)psVar2;
    testing::internal::AssertHelper::AssertHelper
              (&local_8d8,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kinetiknz[P]cubeb/test/test_resampler.cpp"
               ,0x434,pcVar3);
    testing::internal::AssertHelper::operator=(&local_8d8,(Message *)&local_8b8);
    testing::internal::AssertHelper::~AssertHelper(&local_8d8);
    if ((stringstream *)local_8b8._vptr_cubeb_resampler_speex_one_way != (stringstream *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         ((stringstream *)local_8b8._vptr_cubeb_resampler_speex_one_way != (stringstream *)0x0)) {
        (**(code **)((long)*local_8b8._vptr_cubeb_resampler_speex_one_way + 8))();
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(local_810,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  }
  else {
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(local_810,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    cubeb_resampler_speex_one_way<float>::cubeb_resampler_speex_one_way
              (&local_8b8,2,0xac44,0xac44,1);
    memset(local_818,0,0x800);
    auto_array<float>::push
              (&local_8b8.resampling_in_buffer,(float *)local_818,
               (ulong)local_8b8.super_processor.channels << 8);
    fVar5 = (float)-(int)(local_8b8.resampling_in_buffer.length_ /
                         local_8b8.super_processor.channels) * local_8b8.resampling_ratio -
            (float)(int)(local_8b8.resampling_out_buffer.length_ /
                        local_8b8.super_processor.channels);
    if (0.0 <= fVar5) {
      fVar5 = ceilf(fVar5);
      uVar4 = (uint)(long)fVar5;
    }
    local_8e0.ptr_ =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
         ((ulong)local_8e0.ptr_._4_4_ << 0x20);
    local_8c8[0] = uVar4;
    testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
              ((internal *)&local_8d8,"frames_needed2","0u",local_8c8,(uint *)&local_8e0);
    if (local_8d8.data_._0_1_ == (internal)0x0) {
      psVar2 = (stringstream *)operator_new(0x188);
      std::__cxx11::stringstream::stringstream(psVar2);
      *(undefined8 *)(psVar2 + *(long *)(*(long *)(psVar2 + 0x10) + -0x18) + 0x18) = 0x11;
      if (local_8d0.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
         ) {
        pcVar3 = "";
      }
      else {
        pcVar3 = ((local_8d0.ptr_)->_M_dataplus)._M_p;
      }
      local_8e0.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)psVar2;
      testing::internal::AssertHelper::AssertHelper
                (&local_8c0,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kinetiknz[P]cubeb/test/test_resampler.cpp"
                 ,0x43c,pcVar3);
      testing::internal::AssertHelper::operator=(&local_8c0,(Message *)&local_8e0);
      testing::internal::AssertHelper::~AssertHelper(&local_8c0);
      if (local_8e0.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        bVar1 = testing::internal::IsTrue(true);
        if ((bVar1) &&
           (local_8e0.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
          (**(code **)(*(long *)local_8e0.ptr_ + 8))();
        }
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_8d0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    cubeb_resampler_speex_one_way<float>::~cubeb_resampler_speex_one_way(&local_8b8);
  }
  if (pvStack_838 != (void *)0x0) {
    operator_delete__(pvStack_838);
  }
  if (local_850.data_ != (float *)0x0) {
    operator_delete__(local_850.data_);
  }
  return;
}

Assistant:

TEST(cubeb, individual_methods) {
  const uint32_t channels = 2;
  const uint32_t sample_rate = 44100;
  const uint32_t frames = 256;

  delay_line<float> dl(10, channels, sample_rate);
  uint32_t frames_needed1 = dl.input_needed_for_output(0);
  ASSERT_EQ(frames_needed1, 0u);

  cubeb_resampler_speex_one_way<float> one_way(channels, sample_rate, sample_rate, CUBEB_RESAMPLER_QUALITY_DEFAULT);
  float buffer[channels * frames] = {0.0};
  // Add all frames in the resampler's internal buffer.
  one_way.input(buffer, frames);
  // Ask for less than the existing frames, this would create a uint overlflow without the fix.
  uint32_t frames_needed2 = one_way.input_needed_for_output(0);
  ASSERT_EQ(frames_needed2, 0u);
}